

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSet<char16_t>::GetNextRange
          (CharSet<char16_t> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  CharBitvec *this_00;
  char16 cVar1;
  Char CVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  CharSetNode *pCVar7;
  uint index;
  Char local_34;
  Char local_32 [3];
  Char tempLowChar;
  Char tempHighChar;
  
  uVar3 = Count(this);
  if (uVar3 == 0) {
    return false;
  }
  if (uVar3 == 1) {
    cVar1 = Singleton(this);
    if ((ushort)searchCharStart <= (ushort)cVar1) {
      *outHigherChar = cVar1;
      *outLowerChar = cVar1;
      return true;
    }
    return false;
  }
  pCVar7 = (this->rep).full.root;
  if ((undefined1 *)((long)&pCVar7[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    Sort(this);
    uVar3 = GetCompactLength(this);
    index = 0;
    while( true ) {
      if (uVar3 == index) {
        return false;
      }
      uVar4 = GetCompactCharU(this,index);
      CVar2 = (Char)uVar4;
      if ((ushort)searchCharStart <= (ushort)CVar2) break;
      index = index + 1;
    }
    *outHigherChar = CVar2;
    *outLowerChar = CVar2;
    while( true ) {
      index = index + 1;
      if (uVar3 <= index) {
        return true;
      }
      uVar4 = GetCompactCharU(this,index);
      if ((ushort)*outHigherChar + 1 != (uVar4 & 0xffff)) break;
      *outHigherChar = (Char)uVar4;
    }
    return true;
  }
  if ((ushort)searchCharStart < 0x100) {
    this_00 = &(this->rep).full.direct;
    iVar5 = CharBitvec::NextSet(this_00,(uint)(ushort)searchCharStart);
    if (iVar5 == -1) goto LAB_00cd96de;
    *outLowerChar = (Char)iVar5;
    iVar5 = CharBitvec::NextClear(this_00,iVar5);
    if (iVar5 != -1) {
      local_32[0] = Chars<char16_t>::UTC(iVar5 - 1);
      goto LAB_00cd9777;
    }
    *outHigherChar = L'ÿ';
    pCVar7 = (this->rep).full.root;
    if (pCVar7 == (CharSetNode *)0x0) {
      return true;
    }
    CVar2 = *outHigherChar + L'\x01';
    bVar6 = true;
  }
  else {
LAB_00cd96de:
    if (pCVar7 == (CharSetNode *)0x0) {
      return false;
    }
    CVar2 = L'Ā';
    if (0x100 < (ushort)searchCharStart) {
      CVar2 = searchCharStart;
    }
    bVar6 = false;
  }
  local_32[0] = L'\0';
  local_34 = L'\0';
  iVar5 = (*pCVar7->_vptr_CharSetNode[0xc])(pCVar7,2,(ulong)(ushort)CVar2,&local_34,local_32);
  if ((char)iVar5 == '\0') {
    return bVar6;
  }
  if (bVar6 == false) {
    *outLowerChar = local_34;
  }
  else if ((ushort)*outHigherChar + 1 != (uint)(ushort)local_34) {
    return true;
  }
LAB_00cd9777:
  *outHigherChar = local_32[0];
  return true;
}

Assistant:

bool CharSet<char16>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        int count = this->Count();
        if (count == 0)
        {
            return false;
        }
        else if (count == 1)
        {
            Char singleton = this->Singleton();
            if (singleton < searchCharStart)
            {
                return false;
            }

            *outLowerChar = *outHigherChar = singleton;

            return true;
        }

        if (IsCompact())
        {
            this->Sort();
            uint i = 0;
            size_t compactLength = this->GetCompactLength();
            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar >= searchCharStart)
                {
                    *outLowerChar = *outHigherChar = nextChar;
                    break;
                }
            }

            if (i == compactLength)
            {
                return false;
            }

            i++;

            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar != *outHigherChar + 1)
                {
                    return true;
                }
                *outHigherChar += 1;
            }

            return true;
        }
        else
        {
            bool found = false;
            if (CTU(searchCharStart) < CharSetNode::directSize)
            {
                int nextSet = rep.full.direct.NextSet(searchCharStart);

                if (nextSet != -1)
                {
                    found = true;

                    *outLowerChar = (char16)nextSet;

                    int nextClear = rep.full.direct.NextClear(nextSet);

                    if (nextClear != -1)
                    {
                        *outHigherChar = UTC(nextClear - 1);
                        return true;
                    }

                    *outHigherChar = CharSetNode::directSize - 1;
                }
            }

            if (rep.full.root == nullptr)
            {
                return found;
            }
            Char tempLowChar = 0, tempHighChar = 0;

            if (found)
            {
                searchCharStart = *outHigherChar + 1;
            }
            else
            {
                searchCharStart = searchCharStart > CharSetNode::directSize ? searchCharStart : CharSetNode::directSize;
            }

            if (rep.full.root->GetNextRange(CharSetNode::levels - 1, searchCharStart, &tempLowChar, &tempHighChar) && (!found || tempLowChar == *outHigherChar + 1))
            {
                if (!found)
                {
                    *outLowerChar = tempLowChar;
                }
                *outHigherChar = tempHighChar;
                return true;
            }

            return found;
        }
    }